

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall IteratorTest::coordinateTest<true>(IteratorTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var2;
  logic_error *plVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  value_type *__val;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_a0;
  undefined1 local_70 [16];
  size_t *local_60;
  size_t local_48;
  
  _Var1._M_current = (unsigned_long *)operator_new(0x10);
  *_Var1._M_current = 3;
  _Var1._M_current[1] = 8;
  local_70._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var1._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_70);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_a0,(View<int,_true,_std::allocator<unsigned_long>_> *)local_70,0);
  uVar5 = 0;
  do {
    uVar4 = 0;
    do {
      _Var2._M_current = (unsigned_long *)operator_new(0x10);
      *_Var2._M_current = 0;
      _Var2._M_current[1] = 0;
      andres::Iterator<int,true,std::allocator<unsigned_long>>::
      coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Iterator<int,true,std::allocator<unsigned_long>> *)&local_a0,_Var2);
      if ((uVar4 != *_Var2._M_current) || (_Var2._M_current[1] != uVar5)) {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"test failed.");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_a0);
      operator_delete(_Var2._M_current,0x10);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 8);
  if (local_a0.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(_Var1._M_current,0x10);
  _Var1._M_current = (unsigned_long *)operator_new(0x10);
  *_Var1._M_current = 3;
  _Var1._M_current[1] = 8;
  local_70._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var1._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_70);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_a0,(View<int,_true,_std::allocator<unsigned_long>_> *)local_70,0);
  uVar5 = 0;
  do {
    uVar4 = 0;
    do {
      _Var2._M_current = (unsigned_long *)operator_new(0x10);
      *_Var2._M_current = 0;
      _Var2._M_current[1] = 0;
      andres::Iterator<int,true,std::allocator<unsigned_long>>::
      coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Iterator<int,true,std::allocator<unsigned_long>> *)&local_a0,_Var2);
      if ((uVar4 != *_Var2._M_current) || (_Var2._M_current[1] != uVar5)) {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"test failed.");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_a0);
      operator_delete(_Var2._M_current,0x10);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 8);
  if (local_a0.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(_Var1._M_current,0x10);
  _Var1._M_current = (unsigned_long *)operator_new(0x10);
  *_Var1._M_current = 3;
  _Var1._M_current[1] = 8;
  local_70._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var1._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_a0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_70,0);
  uVar5 = 0;
  do {
    uVar4 = 0;
    do {
      _Var2._M_current = (unsigned_long *)operator_new(0x10);
      *_Var2._M_current = 0;
      _Var2._M_current[1] = 0;
      andres::Iterator<int,true,std::allocator<unsigned_long>>::
      coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Iterator<int,true,std::allocator<unsigned_long>> *)&local_a0,_Var2);
      if ((uVar4 != *_Var2._M_current) || (_Var2._M_current[1] != uVar5)) {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"test failed.");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_a0);
      operator_delete(_Var2._M_current,0x10);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
    uVar5 = uVar5 + 1;
    if (uVar5 == 8) {
      if (local_a0.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      operator_delete(local_60,local_48 * 0x18);
      operator_delete(_Var1._M_current,0x10);
      return;
    }
  } while( true );
}

Assistant:

void IteratorTest::coordinateTest() {
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 3;
        shape[1] = 8;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it(v, 0);

        for(std::size_t y=0; y<8; ++y) {
            for(std::size_t x=0; x<3; ++x) {
                std::vector<std::size_t> c(2);
                it.coordinate(c.begin());
                test(c[0] == x && c[1] == y);
                ++it;
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 3;
        shape[1] = 8;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it(v, 0);

        for(std::size_t y=0; y<8; ++y) {
            for(std::size_t x=0; x<3; ++x) {
                std::vector<std::size_t> c(2);
                it.coordinate(c.begin());
                test(c[0] == x && c[1] == y);
                ++it;
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 3;
        shape[1] = 8;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it(v, 0);

        for(std::size_t y=0; y<8; ++y) {
            for(std::size_t x=0; x<3; ++x) {
                std::vector<std::size_t> c(2);
                it.coordinate(c.begin());
                test(c[0] == x && c[1] == y);
                ++it;
            }
        }
    }
}